

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O2

cJSON * cJSON_AddBoolToObject(cJSON *object,char *name,cJSON_bool boolean)

{
  cJSON_bool cVar1;
  cJSON *item;
  cJSON_bool in_R8D;
  
  item = cJSON_CreateBool(boolean);
  cVar1 = add_item_to_object(object,name,item,(internal_hooks *)0x0,in_R8D);
  if (cVar1 == 0) {
    cJSON_Delete(item);
    item = (cJSON *)0x0;
  }
  return item;
}

Assistant:

CJSON_PUBLIC(cJSON*) cJSON_AddBoolToObject(cJSON * const object, const char * const name, const cJSON_bool boolean)
{
    cJSON *bool_item = cJSON_CreateBool(boolean);
    if (add_item_to_object(object, name, bool_item, &global_hooks, false))
    {
        return bool_item;
    }

    cJSON_Delete(bool_item);
    return NULL;
}